

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodeltester.cpp
# Opt level: O0

void __thiscall
QAbstractItemModelTesterPrivate::dataChanged
          (QAbstractItemModelTesterPrivate *this,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QAbstractItemModel *pQVar6;
  QModelIndex *in_RDX;
  QModelIndex *in_RSI;
  QAbstractItemModelTesterPrivate *in_RDI;
  long in_FS_OFFSET;
  int columnCount;
  int rowCount;
  char *in_stack_00000040;
  char *in_stack_00000048;
  QModelIndex *in_stack_00000050;
  QModelIndex commonParent;
  int in_stack_000000d0;
  QModelIndex *in_stack_ffffffffffffff90;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QModelIndex::isValid(in_stack_ffffffffffffff90);
  uVar2 = verify(in_RDI,(EVP_PKEY_CTX *)(ulong)bVar1,(uchar *)"topLeft.isValid()",0x1b6819,
                 (uchar *)
                 "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                 ,0x3e4);
  if ((uVar2 & 1) != 0) {
    bVar1 = QModelIndex::isValid(in_stack_ffffffffffffff90);
    uVar2 = verify(in_RDI,(EVP_PKEY_CTX *)(ulong)bVar1,(uchar *)"bottomRight.isValid()",0x1b6819,
                   (uchar *)
                   "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                   ,0x3e5);
    if ((uVar2 & 1) != 0) {
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QModelIndex::parent((QModelIndex *)in_RDI);
      QModelIndex::parent((QModelIndex *)in_RDI);
      bVar1 = compare<QModelIndex,QModelIndex>
                        ((QAbstractItemModelTesterPrivate *)commonParent.i,
                         (QModelIndex *)commonParent._0_8_,in_stack_00000050,in_stack_00000048,
                         in_stack_00000040,(char *)this,in_stack_000000d0);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        iVar3 = QModelIndex::row(in_RSI);
        iVar4 = QModelIndex::row(in_RDX);
        uVar2 = verify(in_RDI,(EVP_PKEY_CTX *)(ulong)(iVar3 <= iVar4),
                       (uchar *)"topLeft.row() <= bottomRight.row()",0x1b6819,
                       (uchar *)
                       "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                       ,1000);
        if ((uVar2 & 1) != 0) {
          iVar3 = QModelIndex::column(in_RSI);
          iVar4 = QModelIndex::column(in_RDX);
          uVar2 = verify(in_RDI,(EVP_PKEY_CTX *)(ulong)(iVar3 <= iVar4),
                         (uchar *)"topLeft.column() <= bottomRight.column()",0x1b6819,
                         (uchar *)
                         "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                         ,0x3e9);
          if ((uVar2 & 1) != 0) {
            pQVar6 = QPointer<QAbstractItemModel>::operator->
                               ((QPointer<QAbstractItemModel> *)0x192f96);
            iVar3 = (**(code **)(*(long *)pQVar6 + 0x78))(pQVar6,&local_20);
            pQVar6 = QPointer<QAbstractItemModel>::operator->
                               ((QPointer<QAbstractItemModel> *)0x192fb6);
            iVar4 = (**(code **)(*(long *)pQVar6 + 0x80))(pQVar6,&local_20);
            iVar5 = QModelIndex::row(in_RDX);
            uVar2 = verify(in_RDI,(EVP_PKEY_CTX *)(ulong)(iVar5 < iVar3),
                           (uchar *)"bottomRight.row() < rowCount",0x1b6819,
                           (uchar *)
                           "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                           ,0x3ec);
            if ((uVar2 & 1) != 0) {
              iVar3 = QModelIndex::column(in_RDX);
              verify(in_RDI,(EVP_PKEY_CTX *)(ulong)(iVar3 < iVar4),
                     (uchar *)"bottomRight.column() < columnCount",0x1b6819,
                     (uchar *)
                     "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                     ,0x3ed);
            }
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemModelTesterPrivate::dataChanged(const QModelIndex &topLeft, const QModelIndex &bottomRight)
{
    MODELTESTER_VERIFY(topLeft.isValid());
    MODELTESTER_VERIFY(bottomRight.isValid());
    QModelIndex commonParent = bottomRight.parent();
    MODELTESTER_COMPARE(topLeft.parent(), commonParent);
    MODELTESTER_VERIFY(topLeft.row() <= bottomRight.row());
    MODELTESTER_VERIFY(topLeft.column() <= bottomRight.column());
    int rowCount = model->rowCount(commonParent);
    int columnCount = model->columnCount(commonParent);
    MODELTESTER_VERIFY(bottomRight.row() < rowCount);
    MODELTESTER_VERIFY(bottomRight.column() < columnCount);
}